

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader-compiler.c
# Opt level: O1

void print_ast_datatype(FILE *io,MOJOSHADER_astDataType *dt)

{
  uint uVar1;
  size_t __size;
  int __c;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
LAB_0010a2e8:
  if (dt == (MOJOSHADER_astDataType *)0x0) {
    return;
  }
  switch(dt->type) {
  case MOJOSHADER_AST_DATATYPE_BOOL:
    pcVar2 = "bool";
    goto LAB_0010a411;
  case MOJOSHADER_AST_DATATYPE_INT:
    pcVar2 = "int";
    __size = 3;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_UINT:
    pcVar2 = "uint";
    goto LAB_0010a411;
  case MOJOSHADER_AST_DATATYPE_FLOAT:
    pcVar2 = "float";
    __size = 5;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
    pcVar2 = "snorm float";
    break;
  case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
    pcVar2 = "unorm float";
    break;
  case MOJOSHADER_AST_DATATYPE_HALF:
    pcVar2 = "half";
    goto LAB_0010a411;
  case MOJOSHADER_AST_DATATYPE_DOUBLE:
    pcVar2 = "double";
    goto LAB_0010a400;
  case MOJOSHADER_AST_DATATYPE_STRING:
    pcVar2 = "string";
LAB_0010a400:
    __size = 6;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_1D:
    pcVar2 = "sampler1D";
    goto LAB_0010a422;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_2D:
    pcVar2 = "sampler2D";
    goto LAB_0010a422;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_3D:
    pcVar2 = "sampler3D";
LAB_0010a422:
    __size = 9;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE:
    pcVar2 = "samplerCUBE";
    break;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_STATE:
    pcVar2 = "sampler_state";
    __size = 0xd;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE:
    pcVar2 = "SamplerComparisonState";
    __size = 0x16;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_STRUCT:
    fwrite("struct { ",9,1,(FILE *)io);
    if (0 < (dt->array).elements) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        print_ast_datatype(io,*(MOJOSHADER_astDataType **)((long)(dt->array).base + lVar3));
        fprintf((FILE *)io," %s; ",
                *(undefined8 *)((long)&((dt->structure).members)->identifier + lVar3));
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar4 < (dt->array).elements);
    }
    __c = 0x7d;
LAB_0010a532:
    fputc(__c,(FILE *)io);
    return;
  case MOJOSHADER_AST_DATATYPE_ARRAY:
    print_ast_datatype(io,(dt->array).base);
    uVar1 = (dt->array).elements;
    if (-1 < (int)uVar1) {
      pcVar2 = "[%d]";
      goto LAB_0010a374;
    }
    pcVar2 = "[]";
    __size = 2;
    goto LAB_0010a564;
  case MOJOSHADER_AST_DATATYPE_VECTOR:
    fwrite("vector<",7,1,(FILE *)io);
    print_ast_datatype(io,(dt->array).base);
    uVar1 = (dt->array).elements;
    pcVar2 = ",%d>";
LAB_0010a374:
    fprintf((FILE *)io,pcVar2,(ulong)uVar1);
    return;
  case MOJOSHADER_AST_DATATYPE_MATRIX:
    fwrite("matrix<",7,1,(FILE *)io);
    print_ast_datatype(io,(dt->array).base);
    fprintf((FILE *)io,",%d,%d>",(ulong)(uint)(dt->array).elements,(ulong)(uint)(dt->matrix).columns
           );
    return;
  case MOJOSHADER_AST_DATATYPE_BUFFER:
    fwrite("buffer<",7,1,(FILE *)io);
    print_ast_datatype(io,(dt->array).base);
    __c = 0x3e;
    goto LAB_0010a532;
  case MOJOSHADER_AST_DATATYPE_FUNCTION:
    goto switchD_0010a302_caseD_15;
  case MOJOSHADER_AST_DATATYPE_USER:
    fputs((dt->user).name,(FILE *)io);
    return;
  default:
    __assert_fail("0 && \"Unexpected datatype.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/utils/mojoshader-compiler.c"
                  ,0xb9,"void print_ast_datatype(FILE *, const MOJOSHADER_astDataType *)");
  }
  __size = 0xb;
  goto LAB_0010a564;
switchD_0010a302_caseD_15:
  dt = (dt->array).base;
  if (dt == (MOJOSHADER_astDataType *)0x0) {
    pcVar2 = "void";
LAB_0010a411:
    __size = 4;
LAB_0010a564:
    fwrite(pcVar2,__size,1,(FILE *)io);
    return;
  }
  goto LAB_0010a2e8;
}

Assistant:

static void print_ast_datatype(FILE *io, const MOJOSHADER_astDataType *dt)
{
    int i;

    if (dt == NULL)
        return;

    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
            fprintf(io, "bool");
            return;
        case MOJOSHADER_AST_DATATYPE_INT:
            fprintf(io, "int");
            return;
        case MOJOSHADER_AST_DATATYPE_UINT:
            fprintf(io, "uint");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT:
            fprintf(io, "float");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
            fprintf(io, "snorm float");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
            fprintf(io, "unorm float");
            return;
        case MOJOSHADER_AST_DATATYPE_HALF:
            fprintf(io, "half");
            return;
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            fprintf(io, "double");
            return;
        case MOJOSHADER_AST_DATATYPE_STRING:
            fprintf(io, "string");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_1D:
            fprintf(io, "sampler1D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_2D:
            fprintf(io, "sampler2D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_3D:
            fprintf(io, "sampler3D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE:
            fprintf(io, "samplerCUBE");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_STATE:
            fprintf(io, "sampler_state");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE:
            fprintf(io, "SamplerComparisonState");
            return;

        case MOJOSHADER_AST_DATATYPE_STRUCT:
            fprintf(io, "struct { ");
            for (i = 0; i < dt->structure.member_count; i++)
            {
                print_ast_datatype(io, dt->structure.members[i].datatype);
                fprintf(io, " %s; ", dt->structure.members[i].identifier);
            } // for
            fprintf(io, "}");
            return;

        case MOJOSHADER_AST_DATATYPE_ARRAY:
            print_ast_datatype(io, dt->array.base);
            if (dt->array.elements < 0)
                fprintf(io, "[]");
            else
                fprintf(io, "[%d]", dt->array.elements);
            return;

        case MOJOSHADER_AST_DATATYPE_VECTOR:
            fprintf(io, "vector<");
            print_ast_datatype(io, dt->vector.base);
            fprintf(io, ",%d>", dt->vector.elements);
            return;

        case MOJOSHADER_AST_DATATYPE_MATRIX:
            fprintf(io, "matrix<");
            print_ast_datatype(io, dt->matrix.base);
            fprintf(io, ",%d,%d>", dt->matrix.rows, dt->matrix.columns);
            return;

        case MOJOSHADER_AST_DATATYPE_BUFFER:
            fprintf(io, "buffer<");
            print_ast_datatype(io, dt->buffer.base);
            fprintf(io, ">");
            return;

        case MOJOSHADER_AST_DATATYPE_USER:
            fprintf(io, "%s", dt->user.name);
            return;

        // this should only appear if we did semantic analysis on the AST,
        //  so we only print the return value here.
        case MOJOSHADER_AST_DATATYPE_FUNCTION:
            if (!dt->function.retval)
                fprintf(io, "void");
            else
                print_ast_datatype(io, dt->function.retval);
            return;

        //case MOJOSHADER_AST_DATATYPE_NONE:
        default:
            assert(0 && "Unexpected datatype.");
            return;
    } // switch
}